

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads_unit.cpp
# Opt level: O3

int main(void)

{
  uint *puVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  
  puVar1 = (uint *)cpuid_Version_info(1);
  uVar4 = (ulong)puVar1[3];
  uVar3 = *puVar1 >> 4;
  if (uVar3 < 0x406c) {
    if (uVar3 < 0x2065) {
      if (uVar3 < 0x266) {
        if (uVar3 < 0x6d) {
          uVar4 = (ulong)(uVar3 - 99);
          if (uVar3 - 99 < 2) {
            pcVar6 = "Prescott";
            goto LAB_0010184b;
          }
          if (uVar3 == 0x66) {
            pcVar6 = "Presler";
            goto LAB_0010184b;
          }
        }
        else {
          if (uVar3 == 0x6d) {
            pcVar6 = "Dothan";
            goto LAB_0010184b;
          }
          if (uVar3 == 0x6f) goto switchD_001015f8_caseD_0;
          if (uVar3 == 0x16c) {
            pcVar6 = "Pineview";
            goto LAB_0010184b;
          }
        }
      }
      else {
        uVar5 = (ulong)(uVar3 - 0x1066);
        if (uVar3 - 0x1066 < 9) {
          uVar4 = (long)&switchD_001015f8::switchdataD_0011f010 +
                  (long)(int)(&switchD_001015f8::switchdataD_0011f010)[uVar5];
          switch(uVar5) {
          case 0:
switchD_001015f8_caseD_0:
            pcVar6 = "Merom";
            goto LAB_0010184b;
          case 1:
          case 7:
            pcVar6 = "Penryn";
            goto LAB_0010184b;
          case 4:
          case 8:
switchD_001015f8_caseD_4:
            pcVar6 = "Nehalem";
            goto LAB_0010184b;
          }
        }
        else {
          uVar4 = uVar5;
          if (uVar3 == 0x266) {
            pcVar6 = "Lincroft";
            goto LAB_0010184b;
          }
          if (uVar3 == 0x366) {
            pcVar6 = "Cedarview";
            goto LAB_0010184b;
          }
        }
      }
    }
    else if (uVar3 < 0x306a) {
      uVar3 = uVar3 - 0x2065;
      if (uVar3 < 0xb) {
        uVar4 = 0x481;
        if ((0x481U >> (uVar3 & 0x1f) & 1) != 0) {
          pcVar6 = "Westmere";
          goto LAB_0010184b;
        }
        uVar4 = 0x120;
        if ((0x120U >> (uVar3 & 0x1f) & 1) != 0) {
          pcVar6 = "SandyBridge";
          goto LAB_0010184b;
        }
        if (uVar3 == 9) goto switchD_001015f8_caseD_4;
      }
    }
    else if (uVar3 < 0x306d) {
      if (uVar3 == 0x306a) {
        pcVar6 = "IvyBridge";
        goto LAB_0010184b;
      }
      if (uVar3 == 0x306c) {
        pcVar6 = "Haswell";
        goto LAB_0010184b;
      }
    }
    else {
      if (uVar3 == 0x306d) {
        pcVar6 = "Broadwell";
        goto LAB_0010184b;
      }
      if (uVar3 == 0x30f1) goto LAB_001017de;
    }
  }
  else if (uVar3 < 0x9067) {
    if (uVar3 < 0x706a) {
      if (uVar3 < 0x606a) {
        if (uVar3 == 0x406c) {
          pcVar6 = "CherryTrail";
          goto LAB_0010184b;
        }
        if (uVar3 == 0x506c) goto LAB_0010177e;
        if (uVar3 == 0x506e) {
          pcVar6 = "Skylake";
          goto LAB_0010184b;
        }
      }
      else {
        if (uVar3 == 0x606a) {
LAB_0010178a:
          pcVar6 = "Icelake";
          goto LAB_0010184b;
        }
        if ((uVar3 == 0x60f0) || (uVar3 == 0x60f8)) {
LAB_001017de:
          pcVar6 = "Zen2";
          goto LAB_0010184b;
        }
      }
    }
    else if (uVar3 < 0x806c) {
      if (uVar3 == 0x706a) {
LAB_0010177e:
        pcVar6 = "Goldmont";
        goto LAB_0010184b;
      }
      if (uVar3 == 0x706e) goto LAB_0010178a;
      if (uVar3 == 0x70f1) goto LAB_001017de;
    }
    else {
      uVar4 = (ulong)(uVar3 - 0x806c);
      if (uVar3 - 0x806c < 2) {
        pcVar6 = "TigerLake";
        goto LAB_0010184b;
      }
      if (uVar3 == 0x806e) {
LAB_001017ee:
        pcVar6 = "Kabylake";
        goto LAB_0010184b;
      }
    }
  }
  else if (uVar3 < 0xa067) {
    if (uVar3 < 0x90f0) {
      if ((uVar3 == 0x9067) || (uVar3 == 0x906a)) {
        pcVar6 = "Alderlake";
        goto LAB_0010184b;
      }
      if (uVar3 == 0x906e) goto LAB_001017ee;
    }
    else {
      uVar4 = (ulong)(uVar3 - 0xa065);
      if (uVar3 - 0xa065 < 2) {
        pcVar6 = "Cometlake";
        goto LAB_0010184b;
      }
      if (uVar3 == 0x90f0) goto LAB_001017de;
    }
  }
  else if (uVar3 < 0x40f40) {
    if (uVar3 == 0xa067) {
      pcVar6 = "Rocketlake";
      goto LAB_0010184b;
    }
    if (uVar3 == 0xb067) {
      pcVar6 = "Raptorlake";
      goto LAB_0010184b;
    }
    if (uVar3 == 0x20f10) goto LAB_00101796;
  }
  else {
    if (uVar3 == 0x40f40) {
      pcVar6 = "Zen3+";
      goto LAB_0010184b;
    }
    if (uVar3 == 0x50f00) {
LAB_00101796:
      pcVar6 = "Zen3";
      goto LAB_0010184b;
    }
    if (uVar3 == 0x60f10) {
      pcVar6 = "Zen4";
      goto LAB_0010184b;
    }
  }
  pcVar6 = "unknown";
LAB_0010184b:
  printf("x64 processor:  %s\t",pcVar6,(ulong)puVar1[2],uVar4);
  printf(" compiler version: %s\t",
         "Clang 19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
        );
  putchar(10);
  lVar2 = cpuid(0x80000006);
  if ((char)*(undefined4 *)(lVar2 + 0xc) != '@') {
    lVar2 = cpuid(0x80000006);
    printf("cache line: %d bytes\n",(ulong)(byte)*(uint *)(lVar2 + 0xc),(ulong)*(uint *)(lVar2 + 8),
           (ulong)*(uint *)(lVar2 + 0xc));
  }
  run_threads_unit_tests();
  puts("code run completed.");
  return 0;
}

Assistant:

int main() {
    roaring::misc::tellmeall();
    bool is_ok = run_threads_unit_tests();
    if (is_ok) {
        printf("code run completed.\n");
    }
    return is_ok ? EXIT_SUCCESS : EXIT_FAILURE;
}